

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::PeelAvalancheOnSolve(Codec *this,uint16_t column_i)

{
  anon_union_2_3_10dc256e_for_PeelColumn_1 *paVar1;
  PeelRow *row;
  ushort row_i;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  PeelColumn *pPVar5;
  uint16_t uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  short sVar11;
  undefined6 in_register_00000032;
  short sVar12;
  ushort uVar13;
  short sVar14;
  ulong uVar15;
  long lVar16;
  bool bVar17;
  
  lVar16 = (ulong)(uint)((int)CONCAT62(in_register_00000032,column_i) << 6) +
           (CONCAT62(in_register_00000032,column_i) & 0xffffffff) * 2;
  sVar11 = *(short *)((long)this->_peel_col_refs->Rows + lVar16 + -2);
  if (sVar11 != 0) {
    lVar16 = (long)this->_peel_col_refs->Rows + lVar16 + -2;
    do {
      row_i = *(ushort *)(lVar16 + 2);
      row = this->_peel_rows + row_i;
      uVar6 = row->UnmarkedCount;
      row->UnmarkedCount = uVar6 - 1;
      if (uVar6 == 3) {
        uVar2 = this->_block_count;
        uVar3 = this->_block_next_prime;
        uVar9 = (ulong)(row->Params).PeelFirst;
        uVar4 = (row->Params).PeelAdd;
        uVar13 = 0;
        sVar12 = (row->Params).PeelCount - 1;
        do {
          pPVar5 = this->_peel_cols;
          uVar8 = uVar9 & 0xffff;
          if (pPVar5[uVar8].Mark == '\0') {
            uVar15 = (ulong)uVar13;
            uVar13 = uVar13 + 1;
            *(short *)((long)&row->Marks + uVar15 * 2) = (short)uVar9;
            paVar1 = &pPVar5[uVar8].field_1;
            paVar1->Weight2Refs = paVar1->Weight2Refs + 1;
          }
          sVar14 = sVar12;
          if (sVar12 != 0) {
            sVar14 = sVar12 + -1;
            uVar9 = (ulong)((int)uVar8 + (uint)uVar4) % (ulong)uVar3;
            if ((uint)uVar2 <= (uint)uVar9) {
              uVar7 = (uint)uVar3 - (uint)uVar9;
              uVar10 = uVar7 & 0xffff;
              if (uVar4 < (ushort)uVar7) {
                uVar9 = (ulong)((uint)uVar4 * 0x10000 - uVar10) % (ulong)(uint)uVar4;
              }
              else {
                uVar9 = (ulong)(uVar4 - uVar10);
              }
            }
          }
          bVar17 = sVar12 != 0;
          sVar12 = sVar14;
        } while (bVar17);
        if (uVar13 < 2) {
          row->UnmarkedCount = 0;
          if (uVar13 == 1) {
            uVar6 = (row->Marks).Unmarked[0];
            goto LAB_0010387d;
          }
LAB_00103884:
          row->NextRow = this->_defer_head_rows;
          this->_defer_head_rows = row_i;
        }
      }
      else if (uVar6 == 2) {
        uVar6 = (row->Marks).Unmarked[0];
        if (uVar6 == column_i) {
          uVar6 = (row->Marks).Unmarked[1];
        }
        if (this->_peel_cols[uVar6].Mark != '\0') goto LAB_00103884;
LAB_0010387d:
        SolveWithPeel(this,row,row_i,uVar6);
      }
      lVar16 = lVar16 + 2;
      sVar11 = sVar11 + -1;
    } while (sVar11 != 0);
  }
  return;
}

Assistant:

void Codec::PeelAvalancheOnSolve(
    uint16_t column_i ///< Column that was solved
)
{
    PeelRefs * GF256_RESTRICT refs = &_peel_col_refs[column_i];
    uint16_t ref_row_count = refs->RowCount;
    uint16_t * GF256_RESTRICT ref_rows = refs->Rows;

    // Walk list of peeled rows referenced by this newly solved column
    while (ref_row_count--)
    {
        // Update unmarked row count for this referenced row
        uint16_t ref_row_i = *ref_rows++;
        PeelRow * GF256_RESTRICT ref_row = &_peel_rows[ref_row_i];
        uint16_t unmarked_count = --ref_row->UnmarkedCount;

        // If row may be solving a column now:
        if (unmarked_count == 1)
        {
            uint16_t new_column_i = ref_row->Marks.Unmarked[0];

            // If that is this column:
            if (new_column_i == column_i) {
                new_column_i = ref_row->Marks.Unmarked[1];
            }

            /*
                Rows that are to be deferred will either end up
                here or below where it handles the case of there
                being no columns unmarked in a row.
            */

            // If column is already solved:
            if (_peel_cols[new_column_i].Mark == MARK_TODO)
            {
                SolveWithPeel(
                    ref_row,
                    ref_row_i,
                    new_column_i);
                continue;
            }

            CAT_IF_DUMP(cout << "PeelAvalancheOnSolve: Deferred(1) with column " <<
                column_i << " at row " << ref_row_i << endl;)

            // Link at head of defer list
            ref_row->NextRow = _defer_head_rows;
            _defer_head_rows = ref_row_i;
        }
        else if (unmarked_count == 2)
        {
            // Regenerate the row columns to discover which are unmarked
            PeelRowIterator ref_iter(ref_row->Params, _block_count, _block_next_prime);

            uint16_t store_count = 0;

            // For each column:
            do
            {
                const uint16_t ref_column_i = ref_iter.GetColumn();

                PeelColumn * GF256_RESTRICT ref_col = &_peel_cols[ref_column_i];

                // If column is unmarked:
                if (ref_col->Mark == MARK_TODO)
                {
                    // Store the two unmarked columns in the row
                    ref_row->Marks.Unmarked[store_count++] = ref_column_i;

                    // Increment weight-2 reference count (cannot hurt even if not true)
                    ref_col->Weight2Refs++;
                }
            } while (ref_iter.Iterate());

            /*
                This is a little subtle, but sometimes the avalanche will
                happen here, and sometimes a row will be marked deferred.
            */

            if (store_count <= 1)
            {
                // Insure that this row won't be processed further during this recursion
                ref_row->UnmarkedCount = 0;

                // If row is to be deferred:
                if (store_count == 1)
                {
                    SolveWithPeel(
                        ref_row,
                        ref_row_i,
                        ref_row->Marks.Unmarked[0]);
                    continue;
                }

                CAT_IF_DUMP(cout << "PeelAvalancheOnSolve: Deferred(2) with column " << column_i << " at row " << ref_row_i << endl;)

                // Link at head of defer list
                ref_row->NextRow = _defer_head_rows;
                _defer_head_rows = ref_row_i;
            }
        }
    }
}